

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mousenu.c
# Opt level: O2

_Bool al_install_mouse(void)

{
  _Bool _Var1;
  ALLEGRO_SYSTEM *pAVar2;
  
  _Var1 = true;
  if (new_mouse_driver == (ALLEGRO_MOUSE_DRIVER *)0x0) {
    pAVar2 = al_get_system_driver();
    if (pAVar2->vt->get_mouse_driver != (_func_ALLEGRO_MOUSE_DRIVER_ptr *)0x0) {
      pAVar2 = al_get_system_driver();
      new_mouse_driver = (*pAVar2->vt->get_mouse_driver)();
      _Var1 = (*new_mouse_driver->init_mouse)();
      if (_Var1) {
        _al_add_exit_func(al_uninstall_mouse,"al_uninstall_mouse");
        return true;
      }
      new_mouse_driver = (ALLEGRO_MOUSE_DRIVER *)0x0;
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool al_install_mouse(void)
{
   if (new_mouse_driver)
      return true;
   
   //FIXME: seems A4/A5 driver list stuff doesn't quite agree right now
   if (al_get_system_driver()->vt->get_mouse_driver) {
       new_mouse_driver = al_get_system_driver()->vt->get_mouse_driver();
       if (!new_mouse_driver->init_mouse()) {
          new_mouse_driver = NULL;
          return false;
       }
       _al_add_exit_func(al_uninstall_mouse, "al_uninstall_mouse");
       return true;
   }


   return false;
#if 0

   if (system_driver && system_driver->mouse_drivers)
      driver_list = system_driver->mouse_drivers();
   else
      driver_list = _al_mouse_driver_list;

   ASSERT(driver_list);

   for (i=0; driver_list[i].driver; i++) {
      new_mouse_driver = driver_list[i].driver;
      //name = get_config_text(new_mouse_driver->msedrv_ascii_name);
	  name = new_mouse_driver->msedrv_ascii_name;
      new_mouse_driver->msedrv_name = name;
      new_mouse_driver->msedrv_desc = name;
      if (new_mouse_driver->init_mouse()) {
	 break;
      }
   }

   if (!driver_list[i].driver) {
      new_mouse_driver = NULL;
      return false;
   }
   _al_add_exit_func(al_uninstall_mouse, "al_uninstall_mouse");


   return true;
#endif

}